

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O0

int __thiscall
FFlatVertexBuffer::CreateSubsectorVertices
          (FFlatVertexBuffer *this,subsector_t *sub,secplane_t *plane,int floor)

{
  FFlatVertex *pFVar1;
  uint local_2c;
  uint local_28;
  uint k;
  int idx;
  int floor_local;
  secplane_t *plane_local;
  subsector_t *sub_local;
  FFlatVertexBuffer *this_local;
  
  local_28 = TArray<FFlatVertex,_FFlatVertex>::Reserve(&this->vbo_shadowdata,sub->numlines);
  for (local_2c = 0; local_2c < sub->numlines; local_2c = local_2c + 1) {
    pFVar1 = TArray<FFlatVertex,_FFlatVertex>::operator[](&this->vbo_shadowdata,(long)(int)local_28)
    ;
    FFlatVertex::SetFlatVertex(pFVar1,sub->firstline[local_2c].v1,plane);
    if (((sub->sector->transdoor & 1U) != 0) && (floor != 0)) {
      pFVar1 = TArray<FFlatVertex,_FFlatVertex>::operator[]
                         (&this->vbo_shadowdata,(long)(int)local_28);
      pFVar1->z = pFVar1->z - 1.0;
    }
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

int FFlatVertexBuffer::CreateSubsectorVertices(subsector_t *sub, const secplane_t &plane, int floor)
{
	int idx = vbo_shadowdata.Reserve(sub->numlines);
	for(unsigned int k=0; k<sub->numlines; k++, idx++)
	{
		vbo_shadowdata[idx].SetFlatVertex(sub->firstline[k].v1, plane);
		if (sub->sector->transdoor && floor) vbo_shadowdata[idx].z -= 1.f;
	}
	return idx;
}